

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void walk_ports_recurse0(Port *p,char *name_buffer,size_t buffer_size,Ports *base,void *data,
                        port_walker_t walker,void *runtime,char *old_end,char *write_head,
                        bool expand_bundles,char *read_head,bool ranges)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  size_t in_RCX;
  char *in_RDX;
  Port *in_RSI;
  Ports *in_R8;
  void *in_R9;
  bool bVar7;
  void *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  byte in_stack_00000020;
  undefined7 in_stack_00000021;
  char *in_stack_00000028;
  byte in_stack_00000030;
  int written_1;
  uint i;
  int written;
  uint max;
  ssize_t to_copy;
  char *hash_ptr;
  ssize_t write_space;
  undefined1 in_stack_00000816;
  undefined1 in_stack_00000817;
  port_walker_t in_stack_00000818;
  void *in_stack_00000820;
  Ports *in_stack_00000828;
  size_t in_stack_00000830;
  char *in_stack_00000838;
  Port *in_stack_00000840;
  void *in_stack_00000850;
  char *in_stack_00000858;
  size_t local_98;
  uint local_74;
  size_t local_68;
  undefined2 uVar8;
  undefined6 in_stack_ffffffffffffffb0;
  
  bVar6 = in_stack_00000020 & 1;
  bVar1 = in_stack_00000030 & 1;
  lVar4 = (long)in_RDX - ((long)in_stack_00000018 - (long)in_RSI);
  pcVar5 = strchr(in_stack_00000028 + 1,0x23);
  if (pcVar5 == (char *)0x0) {
    local_98 = strlen(in_stack_00000028);
  }
  else {
    local_98 = (long)pcVar5 - (long)in_stack_00000028;
  }
  local_68 = local_98;
  while( true ) {
    bVar7 = false;
    if (0 < (long)local_68) {
      bVar7 = *in_stack_00000028 != ':';
    }
    if (!bVar7) break;
    *in_stack_00000018 = *in_stack_00000028;
    lVar4 = lVar4 + -1;
    in_stack_00000018 = in_stack_00000018 + 1;
    in_stack_00000028 = in_stack_00000028 + 1;
    local_68 = local_68 - 1;
  }
  if (pcVar5 == (char *)0x0) {
    if (in_stack_00000018[-1] != '/') {
      *in_stack_00000018 = '/';
      in_stack_00000018 = in_stack_00000018 + 1;
    }
    *in_stack_00000018 = '\0';
    walk_ports_recurse(in_stack_00000840,in_stack_00000838,in_stack_00000830,in_stack_00000828,
                       in_stack_00000820,in_stack_00000818,in_stack_00000850,in_stack_00000858,
                       (bool)in_stack_00000817,(bool)in_stack_00000816);
  }
  else {
    in_stack_00000028 = in_stack_00000028 + 1;
    uVar2 = atoi(in_stack_00000028);
    while( true ) {
      iVar3 = isdigit((int)*in_stack_00000028);
      uVar8 = (undefined2)((ulong)lVar4 >> 0x30);
      if (iVar3 == 0) break;
      in_stack_00000028 = in_stack_00000028 + 1;
    }
    if ((bVar1 & 1) == 0) {
      for (local_74 = 0; local_74 < uVar2; local_74 = local_74 + 1) {
        snprintf(in_stack_00000018,0x20,"%d/",(ulong)local_74);
        walk_ports_recurse0(in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                            (port_walker_t)CONCAT17(bVar6,CONCAT16(bVar1,in_stack_ffffffffffffffb0))
                            ,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                            SUB81((ulong)lVar4 >> 0x38,0),
                            (char *)CONCAT71(in_stack_00000021,in_stack_00000020),
                            SUB81((ulong)lVar4 >> 0x30,0));
      }
    }
    else {
      snprintf(in_stack_00000018,0x20,"[0,%d]/",(ulong)(uVar2 - 1));
      walk_ports_recurse0(in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                          (port_walker_t)CONCAT17(bVar6,CONCAT16(bVar1,in_stack_ffffffffffffffb0)),
                          unaff_retaddr,in_stack_00000008,in_stack_00000010,
                          SUB21((ushort)uVar8 >> 8,0),
                          (char *)CONCAT71(in_stack_00000021,in_stack_00000020),SUB21(uVar8,0));
    }
  }
  return;
}

Assistant:

static void walk_ports_recurse0(const Port& p, char* name_buffer,
                                size_t buffer_size, const Ports* base,
                                void* data, port_walker_t walker,
                                void* runtime, char* const old_end, char* write_head,
                                bool expand_bundles, const char* read_head,
                                bool ranges)
{
    ssize_t write_space = buffer_size - (ssize_t)(write_head - name_buffer);
#ifdef NDEBUG
    (void)write_space;
#endif
    const char* hash_ptr = strchr(read_head + 1,'#');
    ssize_t to_copy = hash_ptr ? hash_ptr - read_head : strlen(read_head);

    // Check write space is sufficient
    // The formula is valid for the whole function
    assert(write_space >= to_copy + 32);
    //Append the path, until possible '#'
    //yes, there are subports with ':', e.g. ".../::i"
    while(to_copy-->0 && *read_head != ':')
    {
        *write_head++ = *read_head++;
        --write_space;
    }

    if(hash_ptr)
    {
        //Overwrite the "#.../" by "0/", "1/" ...
        assert(*read_head == '#');
        const unsigned max = atoi(++read_head);
        assert(isdigit(*read_head));
        for(;isdigit(*read_head); ++read_head) {}

        if(*read_head == '/') { ++read_head; }
        if(ranges)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"[0,%d]/", max-1);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
        else for(unsigned i=0; i<max; ++i)
        {
            assert(write_space > 32);
            int written = snprintf(write_head,32,"%d/",i);
            //Recurse
            walk_ports_recurse0(p, name_buffer, buffer_size, base, data, walker,
                                runtime, old_end, write_head + written,
                                expand_bundles, read_head, ranges);
        }
    }
    else
    {
        //Ensure last to trail with "/" before recursion
        if(write_head[-1] != '/')
            *write_head++ = '/';
        *write_head = 0;
        //Recurse
        walk_ports_recurse(p, name_buffer, buffer_size,
                           *base, data, walker, runtime, old_end,
                           expand_bundles, ranges);
    }
}